

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

int nlohmann::
    json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::array_index(string *s)

{
  int iVar1;
  out_of_range *__return_storage_ptr__;
  size_t processed_chars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  processed_chars = 0;
  iVar1 = std::__cxx11::stoi(s,&processed_chars,10);
  if (processed_chars == s->_M_string_length) {
    return iVar1;
  }
  __return_storage_ptr__ = (out_of_range *)__cxa_allocate_exception(0x20);
  std::operator+(&local_58,"unresolved reference token \'",s);
  std::operator+(&local_38,&local_58,"\'");
  detail::out_of_range::create(__return_storage_ptr__,0x194,&local_38);
  __cxa_throw(__return_storage_ptr__,&detail::out_of_range::typeinfo,detail::exception::~exception);
}

Assistant:

static int array_index(const std::string& s) {
		std::size_t processed_chars = 0;
		const int res = std::stoi(s, &processed_chars);

		// check if the string was completely read
		if (JSON_UNLIKELY(processed_chars != s.size())) {
			JSON_THROW(detail::out_of_range::create(404, "unresolved reference token '" + s + "'"));
		}

		return res;
	}